

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

value loader_impl_metadata(loader_impl impl)

{
  size_t size;
  value v;
  value pvVar1;
  loader_impl_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_28;
  value *local_20;
  
  size = set_size(impl->handle_impl_path_map);
  v = value_create_array((value *)0x0,size);
  pvVar1 = (value)0x0;
  if (v != (value)0x0) {
    local_28 = 0;
    local_20 = value_to_array(v);
    set_iterate(impl->handle_impl_path_map,loader_impl_metadata_cb_iterate,&local_28);
    pvVar1 = v;
  }
  return pvVar1;
}

Assistant:

value loader_impl_metadata(loader_impl impl)
{
	struct loader_impl_metadata_cb_iterator_type metadata_iterator;

	value v = value_create_array(NULL, set_size(impl->handle_impl_path_map));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_array(v);

	set_iterate(impl->handle_impl_path_map, &loader_impl_metadata_cb_iterate, (set_cb_iterate_args)&metadata_iterator);

	return v;
}